

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_device_main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int sig;
  ithread_t cmdloop_thread;
  sigset_t sigs_to_catch;
  uint local_9c;
  pthread_t local_98;
  sigset_t local_90;
  
  iVar1 = device_main(argc,argv);
  if (iVar1 == 0) {
    iVar2 = pthread_create(&local_98,(pthread_attr_t *)0x0,TvDeviceCommandLoop,(void *)0x0);
    iVar1 = -0x38f;
    if (iVar2 == 0) {
      sigemptyset(&local_90);
      sigaddset(&local_90,2);
      sigwait(&local_90,(int *)&local_9c);
      SampleUtil_Print("Shutting down on signal %d...\n",(ulong)local_9c);
      iVar1 = TvDeviceStop();
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	int rc;
	ithread_t cmdloop_thread;
#ifdef _WIN32
#else
	int sig;
	sigset_t sigs_to_catch;
#endif
	int code;

	rc = device_main(argc, argv);
	if (rc != UPNP_E_SUCCESS) {
		return rc;
	}

	/* start a command loop thread */
	code = ithread_create(&cmdloop_thread, NULL, TvDeviceCommandLoop, NULL);
	if (code != 0) {
		return UPNP_E_INTERNAL_ERROR;
	}
#ifdef _WIN32
	ithread_join(cmdloop_thread, NULL);
#else
	/* Catch Ctrl-C and properly shutdown */
	sigemptyset(&sigs_to_catch);
	/* Comment the line below if you are running gdb, otherwise you will be
	 * unable to interrupt with CTRL-C. */
	sigaddset(&sigs_to_catch, SIGINT);
	sigwait(&sigs_to_catch, &sig);
	SampleUtil_Print("Shutting down on signal %d...\n", sig);
#endif
	rc = TvDeviceStop();

	return rc;
}